

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.h
# Opt level: O0

uint32_t wasm::Bits::getMaskedBits(uint32_t mask)

{
  int iVar1;
  undefined4 local_c;
  uint32_t mask_local;
  
  if (mask == 0xffffffff) {
    local_c = 0x20;
  }
  else if (mask == 0) {
    local_c = 0;
  }
  else if ((mask & mask + 1) == 0) {
    iVar1 = countLeadingZeroes(mask);
    local_c = 0x20 - iVar1;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

inline uint32_t getMaskedBits(uint32_t mask) {
  if (mask == uint32_t(-1)) {
    return 32; // all the bits
  }
  if (mask == 0) {
    return 0; // trivially not a mask
  }
  // otherwise, see if x & (x + 1) turns this into non-zero value
  // 00011111 & (00011111 + 1) => 0
  if (mask & (mask + 1)) {
    return 0;
  }
  // this is indeed a mask
  return 32 - countLeadingZeroes(mask);
}